

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O3

void get_ss_esp_from_tss(CPUX86State *env,uint32_t *ss_ptr,uint32_t *esp_ptr,int dpl,
                        uintptr_t retaddr)

{
  uint uVar1;
  uint32_t uVar2;
  sbyte sVar3;
  uint uVar4;
  uint mmu_idx;
  abi_ptr aVar5;
  char *fmt;
  ulong uVar6;
  CPUX86State *__mptr;
  
  uVar4 = (env->tr).flags;
  if ((short)uVar4 < 0) {
    if ((uVar4 & 0x700) == 0x100) {
      uVar4 = uVar4 >> 0xb & 1;
      sVar3 = (sbyte)uVar4;
      if ((dpl * 4 + 6 << sVar3) - 1U <= (env->tr).limit) {
        uVar6 = (ulong)((dpl << 2 | 2U) << sVar3);
        aVar5 = (env->tr).base + uVar6;
        uVar1 = env->hflags;
        mmu_idx = 2;
        if (uVar4 == 0) {
          uVar4 = 2;
          if (((uVar1 >> 0x17 & 1) != 0) && (uVar4 = 0, (~uVar1 & 3) != 0)) {
            uVar4 = (uint)env->eflags >> 0x11 & 2;
          }
          uVar2 = cpu_lduw_mmuidx_ra_x86_64(env,aVar5,uVar4,retaddr);
          *esp_ptr = uVar2;
          aVar5 = uVar6 + (env->tr).base + 2;
        }
        else {
          uVar4 = 2;
          if (((uVar1 >> 0x17 & 1) != 0) && (uVar4 = 0, (~uVar1 & 3) != 0)) {
            uVar4 = (uint)env->eflags >> 0x11 & 2;
          }
          uVar2 = cpu_ldl_mmuidx_ra_x86_64(env,aVar5,uVar4,retaddr);
          *esp_ptr = uVar2;
          aVar5 = uVar6 + (env->tr).base + 4;
        }
        if (((env->hflags >> 0x17 & 1) != 0) && (mmu_idx = 0, (~env->hflags & 3) != 0)) {
          mmu_idx = (uint)env->eflags >> 0x11 & 2;
        }
        uVar2 = cpu_lduw_mmuidx_ra_x86_64(env,aVar5,mmu_idx,retaddr);
        *ss_ptr = uVar2;
        return;
      }
      raise_exception_err_ra_x86_64(env,10,(env->tr).selector & 0xfffc,retaddr);
    }
    fmt = "invalid tss type";
  }
  else {
    fmt = "invalid tss";
  }
  cpu_abort_x86_64((CPUState *)(env[-6].mtrr_var + 4),fmt);
}

Assistant:

static inline void get_ss_esp_from_tss(CPUX86State *env, uint32_t *ss_ptr,
                                       uint32_t *esp_ptr, int dpl,
                                       uintptr_t retaddr)
{
    X86CPU *cpu = env_archcpu(env);
    int type, index, shift;

#if 0
    {
        int i;
        printf("TR: base=%p limit=%x\n", env->tr.base, env->tr.limit);
        for (i = 0; i < env->tr.limit; i++) {
            printf("%02x ", env->tr.base[i]);
            if ((i & 7) == 7) {
                printf("\n");
            }
        }
        printf("\n");
    }
#endif

    if (!(env->tr.flags & DESC_P_MASK)) {
        cpu_abort(CPU(cpu), "invalid tss");
    }
    type = (env->tr.flags >> DESC_TYPE_SHIFT) & 0xf;
    if ((type & 7) != 1) {
        cpu_abort(CPU(cpu), "invalid tss type");
    }
    shift = type >> 3;
    index = (dpl * 4 + 2) << shift;
    if (index + (4 << shift) - 1 > env->tr.limit) {
        raise_exception_err_ra(env, EXCP0A_TSS, env->tr.selector & 0xfffc, retaddr);
    }
    if (shift == 0) {
        *esp_ptr = cpu_lduw_kernel_ra(env, env->tr.base + index, retaddr);
        *ss_ptr = cpu_lduw_kernel_ra(env, env->tr.base + index + 2, retaddr);
    } else {
        *esp_ptr = cpu_ldl_kernel_ra(env, env->tr.base + index, retaddr);
        *ss_ptr = cpu_lduw_kernel_ra(env, env->tr.base + index + 4, retaddr);
    }
}